

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grade.h
# Opt level: O3

void __thiscall Grade::print(Grade *this,string *group_id,int day_id)

{
  mapped_type *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"KEK",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"~~~~~~~~~~~~~~~~~~~~~~~~~~ Printing ~~~~~~~~~~~~~~~~~~~~~~~~~~",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
            ::operator[](&this->group_map,group_id);
  Group::print(this_00,(int)group_id);
  return;
}

Assistant:

void Grade::print(std::string group_id, int day_id) {
    std::cout << "KEK" << std::endl;
    //print a group
    std::cout << "~~~~~~~~~~~~~~~~~~~~~~~~~~ Printing ~~~~~~~~~~~~~~~~~~~~~~~~~~" << std::endl;
//    if (dep_id != "") {
//
//        departments[dep_id].print(group_id, day_id);
//    }
//    else {
//            std::cout << "printall" << std::endl;
//    }

    group_map[group_id].print();

}